

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_inlinedHaarWavelets(integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [16];
  interest_point *piVar2;
  integral_image *iimage_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int scale;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 in_register_000013c4 [12];
  float ry;
  float rx;
  int local_e4;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  int local_c8;
  float local_c4;
  float local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  ulong local_a8;
  ulong local_a0;
  interest_point *local_98;
  ulong local_90;
  long local_88;
  integral_image *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined1 auVar27 [64];
  
  auVar22._8_4_ = 0x3effffff;
  auVar22._0_8_ = 0x3effffff3effffff;
  auVar22._12_4_ = 0x3effffff;
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  fVar12 = ipoint->scale;
  auVar32 = ZEXT464((uint)fVar12);
  uVar4 = 0xfffffff8;
  uVar6 = 0;
  local_78 = ZEXT416((uint)fVar12);
  auVar9 = vpternlogd_avx512vl(auVar22,local_78,auVar11,0xf8);
  auVar9 = ZEXT416((uint)(fVar12 + auVar9._0_4_));
  auVar9 = vroundss_avx(auVar9,auVar9,0xb);
  scale = (int)auVar9._0_4_;
  local_c4 = -0.08 / (fVar12 * fVar12);
  auVar10 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)ipoint->y),auVar11,0xf8);
  lVar7 = 0;
  auVar9 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)ipoint->x),auVar11,0xf8);
  auVar29._0_8_ = (double)fVar12;
  auVar29._8_8_ = 0;
  auVar9 = ZEXT416((uint)(ipoint->x + auVar9._0_4_));
  auVar9 = vroundss_avx(auVar9,auVar9,0xb);
  auVar26._0_8_ = (double)auVar9._0_4_;
  auVar26._8_8_ = auVar9._8_8_;
  auVar9 = vfmadd231sd_fma(auVar26,auVar29,ZEXT816(0x3fe0000000000000));
  fVar25 = (float)auVar9._0_8_;
  auVar27 = ZEXT1664(CONCAT124(auVar9._4_12_,fVar25));
  local_d4 = -2.5;
  auVar9 = ZEXT416((uint)(ipoint->y + auVar10._0_4_));
  auVar9 = vroundss_avx(auVar9,auVar9,0xb);
  auVar10._0_8_ = (double)auVar9._0_4_;
  auVar10._8_8_ = auVar9._8_8_;
  auVar9 = vfmadd231sd_fma(auVar10,auVar29,ZEXT816(0x3fe0000000000000));
  auVar30 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
  auVar31 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  fVar12 = 0.0;
  local_98 = ipoint;
  local_80 = iimage;
  do {
    local_d4 = local_d4 + 1.0;
    auVar28._0_4_ = (float)(int)uVar4;
    auVar28._4_12_ = in_register_000013c4;
    lVar7 = (long)(int)lVar7;
    uVar5 = 0xfffffff8;
    local_e4 = -3;
    auVar10 = vfmadd213ss_fma(auVar28,auVar32._0_16_,auVar27._0_16_);
    local_d0 = local_d4 * local_d4;
    auVar11 = vpternlogd_avx512vl(auVar30._0_16_,auVar10,auVar31._0_16_,0xf8);
    auVar10 = ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_));
    auVar10 = vroundss_avx(auVar10,auVar10,0xb);
    auVar23._0_4_ = (int)auVar10._0_4_;
    auVar23._4_4_ = (int)auVar10._4_4_;
    auVar23._8_4_ = (int)auVar10._8_4_;
    auVar23._12_4_ = (int)auVar10._12_4_;
    local_58 = vcvtdq2ps_avx(auVar23);
    fVar21 = -2.5;
    local_a8 = uVar6;
    local_a0 = uVar4;
    do {
      auVar13._0_4_ = (float)(int)uVar5;
      auVar13._4_12_ = in_register_000013c4;
      auVar10 = vfmadd213ss_fma(auVar13,auVar32._0_16_,ZEXT416((uint)(float)auVar9._0_8_));
      fVar21 = fVar21 + 1.0;
      iVar3 = (int)uVar5 + -4;
      auVar11 = vpternlogd_avx512vl(auVar30._0_16_,auVar10,auVar31._0_16_,0xf8);
      auVar10 = ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_));
      auVar10 = vroundss_avx(auVar10,auVar10,0xb);
      auVar14._0_4_ = (int)auVar10._0_4_;
      auVar14._4_4_ = (int)auVar10._4_4_;
      auVar14._8_4_ = (int)auVar10._8_4_;
      auVar14._12_4_ = (int)auVar10._12_4_;
      local_68 = vcvtdq2ps_avx(auVar14);
      _local_b8 = ZEXT816(0) << 0x20;
      local_cc = fVar12;
      local_90 = uVar5;
      local_88 = lVar7;
      do {
        iimage_00 = local_80;
        uVar4 = local_a8;
        auVar15._0_4_ = (float)iVar3;
        auVar15._4_12_ = in_register_000013c4;
        auVar10 = vfmadd213ss_fma(auVar15,auVar32._0_16_,ZEXT416((uint)(float)auVar9._0_8_));
        iVar8 = -0xc;
        auVar11 = vpternlogd_avx512vl(auVar30._0_16_,auVar10,auVar31._0_16_,0xf8);
        auVar10 = ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_));
        auVar11 = vroundss_avx(auVar10,auVar10,0xb);
        auVar16._0_4_ = (int)auVar11._0_4_;
        auVar16._4_4_ = (int)auVar11._4_4_;
        auVar16._8_4_ = (int)auVar11._8_4_;
        auVar16._12_4_ = (int)auVar11._12_4_;
        auVar10 = vcvtdq2ps_avx(auVar16);
        local_bc = (int)auVar11._0_4_ - scale;
        local_c0 = (float)local_68._0_4_ - auVar10._0_4_;
        local_c0 = local_c0 * local_c0;
        local_c8 = iVar3;
        do {
          auVar17._0_4_ = (float)((int)uVar4 + iVar8);
          auVar17._4_12_ = in_register_000013c4;
          auVar10 = vfmadd213ss_fma(auVar17,auVar32._0_16_,ZEXT416((uint)fVar25));
          auVar11 = vpternlogd_avx512vl(auVar30._0_16_,auVar10,auVar31._0_16_,0xf8);
          auVar10 = ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_));
          auVar11 = vroundss_avx(auVar10,auVar10,0xb);
          auVar18._0_4_ = (int)auVar11._0_4_;
          auVar18._4_4_ = (int)auVar11._4_4_;
          auVar18._8_4_ = (int)auVar11._8_4_;
          auVar18._12_4_ = (int)auVar11._12_4_;
          auVar10 = vcvtdq2ps_avx(auVar18);
          fVar12 = (float)local_58._0_4_ - auVar10._0_4_;
          local_48 = expf((fVar12 * fVar12 + local_c0) * local_c4);
          local_d8 = 0.0;
          local_dc = 0.0;
          haarXY(iimage_00,local_bc,(int)auVar11._0_4_ - scale,scale,&local_d8,&local_dc);
          auVar31 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar30 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar32 = ZEXT1664(local_78);
          iVar8 = iVar8 + 1;
          auVar10 = vinsertps_avx(ZEXT416((uint)local_dc),ZEXT416((uint)local_d8),0x10);
          auVar19._0_4_ = local_48 * auVar10._0_4_;
          auVar19._4_4_ = local_48 * auVar10._4_4_;
          auVar19._8_4_ = local_48 * auVar10._8_4_;
          auVar19._12_4_ = local_48 * auVar10._12_4_;
          auVar1._8_4_ = 0x7fffffff;
          auVar1._0_8_ = 0x7fffffff7fffffff;
          auVar1._12_4_ = 0x7fffffff;
          auVar10 = vandps_avx512vl(auVar19,auVar1);
          auVar10 = vmovlhps_avx(auVar19,auVar10);
          local_b8._4_4_ = (float)local_b8._4_4_ + auVar10._4_4_;
          local_b8._0_4_ = (float)local_b8._0_4_ + auVar10._0_4_;
          uStack_b0._0_4_ = (float)uStack_b0 + auVar10._8_4_;
          uStack_b0._4_4_ = uStack_b0._4_4_ + auVar10._12_4_;
        } while (iVar8 != -3);
        iVar3 = local_c8 + 1;
      } while (iVar3 != local_e4);
      iVar3 = (int)local_90;
      fVar12 = expf((fVar21 * fVar21 + local_d0) * -0.22222222);
      piVar2 = local_98;
      auVar20._0_4_ = fVar12 * (float)local_b8._0_4_;
      auVar20._4_4_ = fVar12 * (float)local_b8._4_4_;
      auVar20._8_4_ = fVar12 * (float)uStack_b0;
      auVar20._12_4_ = fVar12 * uStack_b0._4_4_;
      auVar31 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar30 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      auVar32 = ZEXT1664(local_78);
      local_e4 = local_e4 + 5;
      uVar5 = (ulong)(iVar3 + 5);
      auVar24._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar24._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar24._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar24._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar11 = vshufpd_avx(auVar20,auVar20,1);
      *(undefined1 (*) [16])(local_98->descriptor + local_88) = auVar20;
      lVar7 = local_88 + 4;
      auVar10 = vmovshdup_avx(auVar24);
      auVar10 = vfmadd231ss_fma(auVar10,auVar20,auVar20);
      auVar11 = vfmadd213ss_fma(auVar11,auVar11,auVar10);
      auVar10 = vshufps_avx(auVar20,auVar20,0xff);
      auVar10 = vfmadd213ss_fma(auVar10,auVar10,auVar11);
      fVar12 = local_cc + auVar10._0_4_;
    } while (iVar3 < 3);
    auVar27 = ZEXT464((uint)fVar25);
    uVar6 = (ulong)((int)local_a8 + 5);
    uVar4 = (ulong)((int)local_a0 + 5);
  } while ((int)local_a0 < 3);
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    auVar9 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    fVar12 = auVar9._0_4_;
  }
  lVar7 = 0;
  auVar27 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar12)));
  do {
    auVar30 = vmulps_avx512f(auVar27,*(undefined1 (*) [64])(piVar2->descriptor + lVar7));
    *(undefined1 (*) [64])(piVar2->descriptor + lVar7) = auVar30;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_inlinedHaarWavelets(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - using haarXY function to compute Haar Wavelet responses at once
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    // printf("sample_x,y:%i %i int_scale:%i rx:%f ry:%f\n",sample_x_sub_int_scale,sample_y_sub_int_scale, int_scale, rx,ry);

                    // float rx = haarX_improved(iimage, sample_y, sample_x, int_scale*2);
                    // float ry = haarY_improved(iimage, sample_y, sample_x, int_scale*2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}